

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_nl.h
# Opt level: O0

void mp::WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,1,mp::ItemNamer>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,NLBaseReif<1> *nlr,
               ItemNamer *vnam)

{
  NLBaseReif<1> *in_RSI;
  BasicStringRef<char> *in_RDI;
  char *in_stack_ffffffffffffffa8;
  BasicWriter<char> *in_stack_ffffffffffffffd0;
  BasicStringRef<char> in_stack_ffffffffffffffd8;
  
  fmt::BasicStringRef<char>::BasicStringRef(in_RDI,in_stack_ffffffffffffffa8);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  NLBaseReif<1>::GetBVar(in_RSI);
  ItemNamer::at((ItemNamer *)nlr,(size_t)vnam);
  fmt::BasicStringRef<char>::BasicStringRef(in_RDI,in_stack_ffffffffffffffa8);
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                           const NLBaseReif<sense>& nlr,
                           Names& vnam) {
  wrt << "EXPLICIT REIF var: " << vnam.at(nlr.GetBVar());
}